

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keyword_validator_factory.hpp
# Opt level: O0

unique_ptr<jsoncons::jsonschema::type_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::type_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
 __thiscall
jsoncons::jsonschema::
keyword_validator_factory<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
::make_type_validator
          (keyword_validator_factory<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
           *this,compilation_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                 *context,
          basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *sch,
          basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *parent)

{
  json_type jVar1;
  bool bVar2;
  char *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  uri *in_RDI;
  type type_1;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *item;
  iterator __end0;
  iterator __begin0;
  const_array_range_type *__range4;
  type type;
  vector<jsoncons::jsonschema::json_schema_type,_std::allocator<jsoncons::jsonschema::json_schema_type>_>
  expected_types;
  uri schema_location;
  string keyword;
  __normal_iterator<const_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
  *in_stack_fffffffffffffcc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffcd0;
  undefined1 in_stack_fffffffffffffcd8;
  undefined1 in_stack_fffffffffffffcd9;
  undefined1 in_stack_fffffffffffffcda;
  undefined1 in_stack_fffffffffffffcdb;
  undefined1 in_stack_fffffffffffffcdc;
  undefined1 in_stack_fffffffffffffcdd;
  undefined1 in_stack_fffffffffffffcde;
  undefined1 in_stack_fffffffffffffcdf;
  iterator in_stack_fffffffffffffce0;
  string *in_stack_fffffffffffffcf0;
  undefined1 in_stack_fffffffffffffcf8;
  undefined1 in_stack_fffffffffffffcf9;
  undefined1 in_stack_fffffffffffffcfa;
  undefined1 in_stack_fffffffffffffcfb;
  undefined1 in_stack_fffffffffffffcfc;
  undefined1 in_stack_fffffffffffffcfd;
  undefined1 in_stack_fffffffffffffcfe;
  _Head_base<0UL,_jsoncons::jsonschema::type_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_false>
  __args;
  string local_2e8 [8];
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>
  *in_stack_fffffffffffffd20;
  string local_220 [32];
  reference local_200;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *local_1f8;
  __normal_iterator<const_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
  local_1f0;
  const_array_range_type local_1e8;
  range<__gnu_cxx::__normal_iterator<const_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>,___gnu_cxx::__normal_iterator<const_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>
  *local_1d8;
  undefined1 local_1c9;
  undefined4 local_144;
  undefined4 local_140;
  undefined4 local_13c;
  undefined4 local_138;
  undefined4 local_134;
  undefined4 local_130;
  undefined4 local_12c;
  string local_128 [56];
  uri local_f0;
  undefined1 local_49 [73];
  
  pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_49;
  __args._M_head_impl =
       (type_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
        *)in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (pbVar3,(char *)__args._M_head_impl,(allocator<char> *)in_RDI);
  std::allocator<char>::~allocator((allocator<char> *)local_49);
  compilation_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  ::get_base_uri((compilation_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                  *)CONCAT17(in_stack_fffffffffffffcdf,
                             CONCAT16(in_stack_fffffffffffffcde,
                                      CONCAT15(in_stack_fffffffffffffcdd,
                                               CONCAT14(in_stack_fffffffffffffcdc,
                                                        CONCAT13(in_stack_fffffffffffffcdb,
                                                                 CONCAT12(in_stack_fffffffffffffcda,
                                                                          CONCAT11(
                                                  in_stack_fffffffffffffcd9,
                                                  in_stack_fffffffffffffcd8))))))));
  std::
  vector<jsoncons::jsonschema::json_schema_type,_std::allocator<jsoncons::jsonschema::json_schema_type>_>
  ::vector((vector<jsoncons::jsonschema::json_schema_type,_std::allocator<jsoncons::jsonschema::json_schema_type>_>
            *)0x73971a);
  jVar1 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::type
                    ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffffcdf,
                              CONCAT16(in_stack_fffffffffffffcde,
                                       CONCAT15(in_stack_fffffffffffffcdd,
                                                CONCAT14(in_stack_fffffffffffffcdc,
                                                         CONCAT13(in_stack_fffffffffffffcdb,
                                                                  CONCAT12(in_stack_fffffffffffffcda
                                                                           ,CONCAT11(
                                                  in_stack_fffffffffffffcd9,
                                                  in_stack_fffffffffffffcd8))))))));
  if (jVar1 == string_value) {
    basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
    as<std::__cxx11::string>
              ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffffcdf,
                        CONCAT16(in_stack_fffffffffffffcde,
                                 CONCAT15(in_stack_fffffffffffffcdd,
                                          CONCAT14(in_stack_fffffffffffffcdc,
                                                   CONCAT13(in_stack_fffffffffffffcdb,
                                                            CONCAT12(in_stack_fffffffffffffcda,
                                                                     CONCAT11(
                                                  in_stack_fffffffffffffcd9,
                                                  in_stack_fffffffffffffcd8))))))));
    in_stack_fffffffffffffcfe =
         std::operator==(in_stack_fffffffffffffcd0,(char *)in_stack_fffffffffffffcc8);
    if ((bool)in_stack_fffffffffffffcfe) {
      local_12c = 0;
      std::
      vector<jsoncons::jsonschema::json_schema_type,_std::allocator<jsoncons::jsonschema::json_schema_type>_>
      ::push_back((vector<jsoncons::jsonschema::json_schema_type,_std::allocator<jsoncons::jsonschema::json_schema_type>_>
                   *)in_stack_fffffffffffffcd0,(value_type *)in_stack_fffffffffffffcc8);
    }
    else {
      in_stack_fffffffffffffcfd =
           std::operator==(in_stack_fffffffffffffcd0,(char *)in_stack_fffffffffffffcc8);
      if ((bool)in_stack_fffffffffffffcfd) {
        local_130 = 1;
        std::
        vector<jsoncons::jsonschema::json_schema_type,_std::allocator<jsoncons::jsonschema::json_schema_type>_>
        ::push_back((vector<jsoncons::jsonschema::json_schema_type,_std::allocator<jsoncons::jsonschema::json_schema_type>_>
                     *)in_stack_fffffffffffffcd0,(value_type *)in_stack_fffffffffffffcc8);
      }
      else {
        in_stack_fffffffffffffcfc =
             std::operator==(in_stack_fffffffffffffcd0,(char *)in_stack_fffffffffffffcc8);
        if ((bool)in_stack_fffffffffffffcfc) {
          local_134 = 2;
          std::
          vector<jsoncons::jsonschema::json_schema_type,_std::allocator<jsoncons::jsonschema::json_schema_type>_>
          ::push_back((vector<jsoncons::jsonschema::json_schema_type,_std::allocator<jsoncons::jsonschema::json_schema_type>_>
                       *)in_stack_fffffffffffffcd0,(value_type *)in_stack_fffffffffffffcc8);
        }
        else {
          in_stack_fffffffffffffcfb =
               std::operator==(in_stack_fffffffffffffcd0,(char *)in_stack_fffffffffffffcc8);
          if ((bool)in_stack_fffffffffffffcfb) {
            local_138 = 3;
            std::
            vector<jsoncons::jsonschema::json_schema_type,_std::allocator<jsoncons::jsonschema::json_schema_type>_>
            ::push_back((vector<jsoncons::jsonschema::json_schema_type,_std::allocator<jsoncons::jsonschema::json_schema_type>_>
                         *)in_stack_fffffffffffffcd0,(value_type *)in_stack_fffffffffffffcc8);
          }
          else {
            in_stack_fffffffffffffcfa =
                 std::operator==(in_stack_fffffffffffffcd0,(char *)in_stack_fffffffffffffcc8);
            if ((bool)in_stack_fffffffffffffcfa) {
              local_13c = 4;
              std::
              vector<jsoncons::jsonschema::json_schema_type,_std::allocator<jsoncons::jsonschema::json_schema_type>_>
              ::push_back((vector<jsoncons::jsonschema::json_schema_type,_std::allocator<jsoncons::jsonschema::json_schema_type>_>
                           *)in_stack_fffffffffffffcd0,(value_type *)in_stack_fffffffffffffcc8);
            }
            else {
              in_stack_fffffffffffffcf9 =
                   std::operator==(in_stack_fffffffffffffcd0,(char *)in_stack_fffffffffffffcc8);
              if ((bool)in_stack_fffffffffffffcf9) {
                local_140 = 5;
                std::
                vector<jsoncons::jsonschema::json_schema_type,_std::allocator<jsoncons::jsonschema::json_schema_type>_>
                ::push_back((vector<jsoncons::jsonschema::json_schema_type,_std::allocator<jsoncons::jsonschema::json_schema_type>_>
                             *)in_stack_fffffffffffffcd0,(value_type *)in_stack_fffffffffffffcc8);
              }
              else {
                in_stack_fffffffffffffcf8 =
                     std::operator==(in_stack_fffffffffffffcd0,(char *)in_stack_fffffffffffffcc8);
                if (!(bool)in_stack_fffffffffffffcf8) {
                  local_1c9 = 1;
                  __rhs = (char *)__cxa_allocate_exception(0x18);
                  jsoncons::uri::string_abi_cxx11_(&local_f0);
                  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)CONCAT17(jVar1,CONCAT16(in_stack_fffffffffffffcfe,
                                                            CONCAT15(in_stack_fffffffffffffcfd,
                                                                     CONCAT14(
                                                  in_stack_fffffffffffffcfc,
                                                  CONCAT13(in_stack_fffffffffffffcfb,
                                                           CONCAT12(in_stack_fffffffffffffcfa,
                                                                    CONCAT11(
                                                  in_stack_fffffffffffffcf9,
                                                  in_stack_fffffffffffffcf8))))))),__rhs);
                  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)CONCAT17(in_stack_fffffffffffffcdf,
                                             CONCAT16(in_stack_fffffffffffffcde,
                                                      CONCAT15(in_stack_fffffffffffffcdd,
                                                               CONCAT14(in_stack_fffffffffffffcdc,
                                                                        CONCAT13(
                                                  in_stack_fffffffffffffcdb,
                                                  CONCAT12(in_stack_fffffffffffffcda,
                                                           CONCAT11(in_stack_fffffffffffffcd9,
                                                                    in_stack_fffffffffffffcd8)))))))
                                 ,(char *)in_stack_fffffffffffffcd0);
                  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)CONCAT17(in_stack_fffffffffffffcdf,
                                             CONCAT16(in_stack_fffffffffffffcde,
                                                      CONCAT15(in_stack_fffffffffffffcdd,
                                                               CONCAT14(in_stack_fffffffffffffcdc,
                                                                        CONCAT13(
                                                  in_stack_fffffffffffffcdb,
                                                  CONCAT12(in_stack_fffffffffffffcda,
                                                           CONCAT11(in_stack_fffffffffffffcd9,
                                                                    in_stack_fffffffffffffcd8)))))))
                                 ,in_stack_fffffffffffffcd0);
                  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)CONCAT17(in_stack_fffffffffffffcdf,
                                             CONCAT16(in_stack_fffffffffffffcde,
                                                      CONCAT15(in_stack_fffffffffffffcdd,
                                                               CONCAT14(in_stack_fffffffffffffcdc,
                                                                        CONCAT13(
                                                  in_stack_fffffffffffffcdb,
                                                  CONCAT12(in_stack_fffffffffffffcda,
                                                           CONCAT11(in_stack_fffffffffffffcd9,
                                                                    in_stack_fffffffffffffcd8)))))))
                                 ,(char *)in_stack_fffffffffffffcd0);
                  schema_error::schema_error
                            ((schema_error *)in_stack_fffffffffffffce0._M_current,
                             (string *)
                             CONCAT17(in_stack_fffffffffffffcdf,
                                      CONCAT16(in_stack_fffffffffffffcde,
                                               CONCAT15(in_stack_fffffffffffffcdd,
                                                        CONCAT14(in_stack_fffffffffffffcdc,
                                                                 CONCAT13(in_stack_fffffffffffffcdb,
                                                                          CONCAT12(
                                                  in_stack_fffffffffffffcda,
                                                  CONCAT11(in_stack_fffffffffffffcd9,
                                                           in_stack_fffffffffffffcd8))))))));
                  local_1c9 = 0;
                  __cxa_throw(__rhs,&schema_error::typeinfo,schema_error::~schema_error);
                }
                local_144 = 6;
                std::
                vector<jsoncons::jsonschema::json_schema_type,_std::allocator<jsoncons::jsonschema::json_schema_type>_>
                ::push_back((vector<jsoncons::jsonschema::json_schema_type,_std::allocator<jsoncons::jsonschema::json_schema_type>_>
                             *)in_stack_fffffffffffffcd0,(value_type *)in_stack_fffffffffffffcc8);
              }
            }
          }
        }
      }
    }
    std::__cxx11::string::~string(local_128);
  }
  else if (jVar1 == array_value) {
    local_1e8 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::
                array_range(in_stack_fffffffffffffd20);
    in_stack_fffffffffffffce0 = local_1e8.last_._M_current;
    local_1d8 = &local_1e8;
    local_1f0._M_current =
         (basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)
         range<__gnu_cxx::__normal_iterator<const_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>,___gnu_cxx::__normal_iterator<const_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>
         ::begin(local_1d8);
    local_1f8 = (basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)
                range<__gnu_cxx::__normal_iterator<const_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>,___gnu_cxx::__normal_iterator<const_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>
                ::end(local_1d8);
    while( true ) {
      bVar2 = __gnu_cxx::operator!=
                        ((__normal_iterator<const_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
                          *)in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
      if (!bVar2) break;
      local_200 = __gnu_cxx::
                  __normal_iterator<const_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
                  ::operator*(&local_1f0);
      basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
      as<std::__cxx11::string>
                ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffcdf,
                          CONCAT16(in_stack_fffffffffffffcde,
                                   CONCAT15(in_stack_fffffffffffffcdd,
                                            CONCAT14(in_stack_fffffffffffffcdc,
                                                     CONCAT13(in_stack_fffffffffffffcdb,
                                                              CONCAT12(in_stack_fffffffffffffcda,
                                                                       CONCAT11(
                                                  in_stack_fffffffffffffcd9,
                                                  in_stack_fffffffffffffcd8))))))));
      in_stack_fffffffffffffcdf =
           std::operator==(in_stack_fffffffffffffcd0,(char *)in_stack_fffffffffffffcc8);
      if ((bool)in_stack_fffffffffffffcdf) {
        std::
        vector<jsoncons::jsonschema::json_schema_type,_std::allocator<jsoncons::jsonschema::json_schema_type>_>
        ::push_back((vector<jsoncons::jsonschema::json_schema_type,_std::allocator<jsoncons::jsonschema::json_schema_type>_>
                     *)in_stack_fffffffffffffcd0,(value_type *)in_stack_fffffffffffffcc8);
      }
      else {
        in_stack_fffffffffffffcde =
             std::operator==(in_stack_fffffffffffffcd0,(char *)in_stack_fffffffffffffcc8);
        if ((bool)in_stack_fffffffffffffcde) {
          std::
          vector<jsoncons::jsonschema::json_schema_type,_std::allocator<jsoncons::jsonschema::json_schema_type>_>
          ::push_back((vector<jsoncons::jsonschema::json_schema_type,_std::allocator<jsoncons::jsonschema::json_schema_type>_>
                       *)in_stack_fffffffffffffcd0,(value_type *)in_stack_fffffffffffffcc8);
        }
        else {
          in_stack_fffffffffffffcdd =
               std::operator==(in_stack_fffffffffffffcd0,(char *)in_stack_fffffffffffffcc8);
          if ((bool)in_stack_fffffffffffffcdd) {
            std::
            vector<jsoncons::jsonschema::json_schema_type,_std::allocator<jsoncons::jsonschema::json_schema_type>_>
            ::push_back((vector<jsoncons::jsonschema::json_schema_type,_std::allocator<jsoncons::jsonschema::json_schema_type>_>
                         *)in_stack_fffffffffffffcd0,(value_type *)in_stack_fffffffffffffcc8);
          }
          else {
            in_stack_fffffffffffffcdc =
                 std::operator==(in_stack_fffffffffffffcd0,(char *)in_stack_fffffffffffffcc8);
            if ((bool)in_stack_fffffffffffffcdc) {
              std::
              vector<jsoncons::jsonschema::json_schema_type,_std::allocator<jsoncons::jsonschema::json_schema_type>_>
              ::push_back((vector<jsoncons::jsonschema::json_schema_type,_std::allocator<jsoncons::jsonschema::json_schema_type>_>
                           *)in_stack_fffffffffffffcd0,(value_type *)in_stack_fffffffffffffcc8);
            }
            else {
              in_stack_fffffffffffffcdb =
                   std::operator==(in_stack_fffffffffffffcd0,(char *)in_stack_fffffffffffffcc8);
              if ((bool)in_stack_fffffffffffffcdb) {
                std::
                vector<jsoncons::jsonschema::json_schema_type,_std::allocator<jsoncons::jsonschema::json_schema_type>_>
                ::push_back((vector<jsoncons::jsonschema::json_schema_type,_std::allocator<jsoncons::jsonschema::json_schema_type>_>
                             *)in_stack_fffffffffffffcd0,(value_type *)in_stack_fffffffffffffcc8);
              }
              else {
                in_stack_fffffffffffffcda =
                     std::operator==(in_stack_fffffffffffffcd0,(char *)in_stack_fffffffffffffcc8);
                if ((bool)in_stack_fffffffffffffcda) {
                  std::
                  vector<jsoncons::jsonschema::json_schema_type,_std::allocator<jsoncons::jsonschema::json_schema_type>_>
                  ::push_back((vector<jsoncons::jsonschema::json_schema_type,_std::allocator<jsoncons::jsonschema::json_schema_type>_>
                               *)in_stack_fffffffffffffcd0,(value_type *)in_stack_fffffffffffffcc8);
                }
                else {
                  in_stack_fffffffffffffcd9 =
                       std::operator==(in_stack_fffffffffffffcd0,(char *)in_stack_fffffffffffffcc8);
                  if (!(bool)in_stack_fffffffffffffcd9) {
                    pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             __cxa_allocate_exception(0x18);
                    jsoncons::uri::string_abi_cxx11_(&local_f0);
                    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)CONCAT17(jVar1,CONCAT16(in_stack_fffffffffffffcfe,
                                                              CONCAT15(in_stack_fffffffffffffcfd,
                                                                       CONCAT14(
                                                  in_stack_fffffffffffffcfc,
                                                  CONCAT13(in_stack_fffffffffffffcfb,
                                                           CONCAT12(in_stack_fffffffffffffcfa,
                                                                    CONCAT11(
                                                  in_stack_fffffffffffffcf9,
                                                  in_stack_fffffffffffffcf8))))))),
                                   (char *)in_stack_fffffffffffffcf0);
                    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)CONCAT17(in_stack_fffffffffffffcdf,
                                               CONCAT16(in_stack_fffffffffffffcde,
                                                        CONCAT15(in_stack_fffffffffffffcdd,
                                                                 CONCAT14(in_stack_fffffffffffffcdc,
                                                                          CONCAT13(
                                                  in_stack_fffffffffffffcdb,
                                                  CONCAT12(in_stack_fffffffffffffcda,
                                                           CONCAT11(in_stack_fffffffffffffcd9,
                                                                    in_stack_fffffffffffffcd8)))))))
                                   ,(char *)pbVar3);
                    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)CONCAT17(in_stack_fffffffffffffcdf,
                                               CONCAT16(in_stack_fffffffffffffcde,
                                                        CONCAT15(in_stack_fffffffffffffcdd,
                                                                 CONCAT14(in_stack_fffffffffffffcdc,
                                                                          CONCAT13(
                                                  in_stack_fffffffffffffcdb,
                                                  CONCAT12(in_stack_fffffffffffffcda,
                                                           CONCAT11(in_stack_fffffffffffffcd9,
                                                                    in_stack_fffffffffffffcd8)))))))
                                   ,pbVar3);
                    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)CONCAT17(in_stack_fffffffffffffcdf,
                                               CONCAT16(in_stack_fffffffffffffcde,
                                                        CONCAT15(in_stack_fffffffffffffcdd,
                                                                 CONCAT14(in_stack_fffffffffffffcdc,
                                                                          CONCAT13(
                                                  in_stack_fffffffffffffcdb,
                                                  CONCAT12(in_stack_fffffffffffffcda,
                                                           CONCAT11(in_stack_fffffffffffffcd9,
                                                                    in_stack_fffffffffffffcd8)))))))
                                   ,(char *)pbVar3);
                    schema_error::schema_error
                              ((schema_error *)in_stack_fffffffffffffce0._M_current,
                               (string *)
                               CONCAT17(in_stack_fffffffffffffcdf,
                                        CONCAT16(in_stack_fffffffffffffcde,
                                                 CONCAT15(in_stack_fffffffffffffcdd,
                                                          CONCAT14(in_stack_fffffffffffffcdc,
                                                                   CONCAT13(
                                                  in_stack_fffffffffffffcdb,
                                                  CONCAT12(in_stack_fffffffffffffcda,
                                                           CONCAT11(in_stack_fffffffffffffcd9,
                                                                    in_stack_fffffffffffffcd8)))))))
                              );
                    __cxa_throw(pbVar3,&schema_error::typeinfo,schema_error::~schema_error);
                  }
                  std::
                  vector<jsoncons::jsonschema::json_schema_type,_std::allocator<jsoncons::jsonschema::json_schema_type>_>
                  ::push_back((vector<jsoncons::jsonschema::json_schema_type,_std::allocator<jsoncons::jsonschema::json_schema_type>_>
                               *)in_stack_fffffffffffffcd0,(value_type *)in_stack_fffffffffffffcc8);
                }
              }
            }
          }
        }
      }
      std::__cxx11::string::~string(local_220);
      __gnu_cxx::
      __normal_iterator<const_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
      ::operator++(&local_1f0);
    }
  }
  compilation_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  ::get_custom_message
            ((compilation_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
              *)CONCAT17(jVar1,CONCAT16(in_stack_fffffffffffffcfe,
                                        CONCAT15(in_stack_fffffffffffffcfd,
                                                 CONCAT14(in_stack_fffffffffffffcfc,
                                                          CONCAT13(in_stack_fffffffffffffcfb,
                                                                   CONCAT12(
                                                  in_stack_fffffffffffffcfa,
                                                  CONCAT11(in_stack_fffffffffffffcf9,
                                                           in_stack_fffffffffffffcf8))))))),
             in_stack_fffffffffffffcf0);
  std::
  make_unique<jsoncons::jsonschema::type_validator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>,jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>const&,jsoncons::uri,std::__cxx11::string,std::vector<jsoncons::jsonschema::json_schema_type,std::allocator<jsoncons::jsonschema::json_schema_type>>>
            ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)
             __args._M_head_impl,in_RDI,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(jVar1,CONCAT16(in_stack_fffffffffffffcfe,
                                     CONCAT15(in_stack_fffffffffffffcfd,
                                              CONCAT14(in_stack_fffffffffffffcfc,
                                                       CONCAT13(in_stack_fffffffffffffcfb,
                                                                CONCAT12(in_stack_fffffffffffffcfa,
                                                                         CONCAT11(
                                                  in_stack_fffffffffffffcf9,
                                                  in_stack_fffffffffffffcf8))))))),
             (vector<jsoncons::jsonschema::json_schema_type,_std::allocator<jsoncons::jsonschema::json_schema_type>_>
              *)in_stack_fffffffffffffcf0);
  std::__cxx11::string::~string(local_2e8);
  std::
  vector<jsoncons::jsonschema::json_schema_type,_std::allocator<jsoncons::jsonschema::json_schema_type>_>
  ::~vector((vector<jsoncons::jsonschema::json_schema_type,_std::allocator<jsoncons::jsonschema::json_schema_type>_>
             *)in_stack_fffffffffffffce0._M_current);
  jsoncons::uri::~uri((uri *)0x73a0a2);
  std::__cxx11::string::~string((string *)(local_49 + 1));
  return (__uniq_ptr_data<jsoncons::jsonschema::type_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::default_delete<jsoncons::jsonschema::type_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>,_true,_true>
          )(tuple<jsoncons::jsonschema::type_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::default_delete<jsoncons::jsonschema::type_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
            )__args._M_head_impl;
}

Assistant:

std::unique_ptr<type_validator<Json>> make_type_validator(const compilation_context<Json>& context,
            const Json& sch, const Json& parent)
        {
            std::string keyword = "type";
            uri schema_location = context.get_base_uri();
            
            std::vector<json_schema_type> expected_types;

            switch (sch.type()) 
            { 
                case json_type::string_value: 
                {
                    auto type = sch.template as<std::string>();
                    if (type == "null")
                    {
                        expected_types.push_back(json_schema_type::null);
                    }
                    else if (type == "object")
                    {
                        expected_types.push_back(json_schema_type::object);
                    }
                    else if (type == "array")
                    {
                        expected_types.push_back(json_schema_type::array);
                    }
                    else if (type == "string")
                    {
                        expected_types.push_back(json_schema_type::string);
                    }
                    else if (type == "boolean")
                    {
                        expected_types.push_back(json_schema_type::boolean);
                    }
                    else if (type == "integer")
                    {
                        expected_types.push_back(json_schema_type::integer);
                    }
                    else if (type == "number")
                    {
                        expected_types.push_back(json_schema_type::number);
                    }
                    else
                    {
                        JSONCONS_THROW(schema_error(schema_location.string() + ": " + "Invalid type '" + type + "'"));
                    }
                    break;
                } 

                case json_type::array_value: // "type": ["type1", "type2"]
                {
                    for (const auto& item : sch.array_range())
                    {
                        auto type = item.template as<std::string>();
                        if (type == "null")
                        {
                            expected_types.push_back(json_schema_type::null);
                        }
                        else if (type == "object")
                        {
                            expected_types.push_back(json_schema_type::object);
                        }
                        else if (type == "array")
                        {
                            expected_types.push_back(json_schema_type::array);
                        }
                        else if (type == "string")
                        {
                            expected_types.push_back(json_schema_type::string);
                        }
                        else if (type == "boolean")
                        {
                            expected_types.push_back(json_schema_type::boolean);
                        }
                        else if (type == "integer")
                        {
                            expected_types.push_back(json_schema_type::integer);
                        }
                        else if (type == "number")
                        {
                            expected_types.push_back(json_schema_type::number);
                        }
                        else
                        {
                            JSONCONS_THROW(schema_error(schema_location.string() + ": " + "Invalid type '" + type + "'"));
                        }
                    }
                    break;
                }
                default:
                    break;
            }
            
            return jsoncons::make_unique<type_validator<Json>>(parent, std::move(schema_location), context.get_custom_message(keyword), 
                std::move(expected_types));
        }